

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RewardModelMappingSparseMapped.cpp
# Opt level: O0

void __thiscall
RewardModelMappingSparseMapped::~RewardModelMappingSparseMapped
          (RewardModelMappingSparseMapped *this)

{
  RewardModelMappingSparseMapped *in_RDI;
  
  ~RewardModelMappingSparseMapped(in_RDI);
  operator_delete(in_RDI,0x98);
  return;
}

Assistant:

RewardModelMappingSparseMapped::~RewardModelMappingSparseMapped()
{
}